

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

Side * __thiscall Application::convert(Side *__return_storage_ptr__,Application *this,Side side)

{
  char data;
  logic_error *this_00;
  
  data = '1';
  if (side != buy) {
    if (side != sell) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"Unsupported Side, use buy or sell");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    data = '2';
  }
  FIX::CharField::CharField(&__return_storage_ptr__->super_CharField,0x36,data);
  (__return_storage_ptr__->super_CharField).super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_0015b440;
  return __return_storage_ptr__;
}

Assistant:

FIX::Side Application::convert(Order::Side side) {
  switch (side) {
  case Order::buy:
    return FIX::Side(FIX::Side_BUY);
  case Order::sell:
    return FIX::Side(FIX::Side_SELL);
  default:
    throw std::logic_error("Unsupported Side, use buy or sell");
  }
}